

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O1

void __thiscall ThreadServiceWrapperBase::ThreadServiceWrapperBase(ThreadServiceWrapperBase *this)

{
  (this->super_ThreadServiceWrapper)._vptr_ThreadServiceWrapper =
       (_func_int **)&PTR_ScheduleNextCollectOnExit_014f26c8;
  this->hasScheduledIdleCollect = false;
  this->shouldScheduleIdleCollectOnExitIdle = false;
  this->threadContext = (ThreadContext *)0x0;
  *(undefined4 *)((long)&this->threadContext + 7) = 0;
  return;
}

Assistant:

ThreadServiceWrapperBase::ThreadServiceWrapperBase() :
    threadContext(nullptr),
    needIdleCollect(false),
    inIdleCollect(false),
    hasScheduledIdleCollect(false),
    shouldScheduleIdleCollectOnExitIdle(false),
    forceIdleCollectOnce(false)
{
}